

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_Call_single(UA_Server *server,UA_Session *session,UA_CallMethodRequest *request,
                        UA_CallMethodResult *result)

{
  UA_NodeStore *ns;
  size_t __nmemb;
  UA_Boolean UVar1;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_NodeStoreEntry **ppUVar4;
  UA_VariableNode *pUVar5;
  UA_Variant *pUVar6;
  UA_NodeId *n2;
  UA_NodeId *n1;
  size_t sVar7;
  UA_MethodNode *ofMethod;
  UA_String withBrowseName;
  UA_String withBrowseName_00;
  undefined1 local_88 [8];
  UA_NodeId hasComponentNodeId;
  UA_NodeId hasSubTypeNodeId;
  
  ns = server->nodestore;
  ppUVar4 = findNode(ns,&request->methodId);
  if (ppUVar4 == (UA_NodeStoreEntry **)0x0) {
    ofMethod = (UA_MethodNode *)0x0;
  }
  else {
    ofMethod = (UA_MethodNode *)&(*ppUVar4)->node;
  }
  if (ofMethod == (UA_MethodNode *)0x0) {
LAB_00123c44:
    result->statusCode = 0x80750000;
  }
  else {
    if (ofMethod->nodeClass == UA_NODECLASS_METHOD) {
      if (((ofMethod->executable != true) || (ofMethod->userExecutable != true)) ||
         (ofMethod->attachedMethod == (UA_MethodCallback)0x0)) {
        result->statusCode = 0x803b0000;
        return;
      }
      ppUVar4 = findNode(ns,&request->objectId);
      if (ppUVar4 == (UA_NodeStoreEntry **)0x0) {
        n2 = (UA_NodeId *)0x0;
      }
      else {
        n2 = &((*ppUVar4)->node).nodeId;
      }
      if (n2 == (UA_NodeId *)0x0) {
        result->statusCode = 0x80330000;
        return;
      }
      if ((*(int *)(n2 + 1) == 1) || (*(int *)(n2 + 1) == 8)) {
        local_88._0_2_ = 0;
        stack0xffffffffffffff7c = 0x2f00000000;
        hasComponentNodeId.identifier._8_2_ = 0;
        stack0xffffffffffffff94 = 0x2d00000000;
        sVar7 = ofMethod->referencesSize;
        if (sVar7 != 0) {
          n1 = &(ofMethod->references->targetId).nodeId;
          UVar2 = false;
          do {
            if (((n1[-1].identifier.guid.data4[0] == '\x01') &&
                (UVar1 = UA_NodeId_equal(n1,n2), UVar1)) &&
               (UVar2 = isNodeInTree(ns,(UA_NodeId *)((long)&n1[-2].identifier + 8),
                                     (UA_NodeId *)local_88,
                                     (UA_NodeId *)((long)&hasComponentNodeId.identifier + 8),1),
               UVar2)) break;
            n1 = (UA_NodeId *)&n1[3].identifier;
            sVar7 = sVar7 - 1;
          } while (sVar7 != 0);
          if (UVar2 != false) {
            withBrowseName.data = (UA_Byte *)"InputArguments";
            withBrowseName.length = 0xe;
            pUVar5 = getArgumentsVariableNode(server,ofMethod,withBrowseName);
            if (pUVar5 == (UA_VariableNode *)0x0) {
              if (request->inputArgumentsSize != 0) {
                result->statusCode = 0x80ab0000;
                return;
              }
            }
            else {
              UVar3 = argumentsConformsToDefinition
                                (server,pUVar5,request->inputArgumentsSize,request->inputArguments);
              result->statusCode = UVar3;
              if (UVar3 != 0) {
                return;
              }
            }
            result->outputArgumentsSize = 0;
            withBrowseName_00.data = (UA_Byte *)"OutputArguments";
            withBrowseName_00.length = 0xf;
            pUVar5 = getArgumentsVariableNode(server,ofMethod,withBrowseName_00);
            if (pUVar5 != (UA_VariableNode *)0x0) {
              __nmemb = *(size_t *)((long)&pUVar5->value + 0x18);
              if (__nmemb == 0) {
                pUVar6 = (UA_Variant *)0x1;
              }
              else {
                pUVar6 = (UA_Variant *)calloc(__nmemb,0x30);
              }
              result->outputArguments = pUVar6;
              if (pUVar6 == (UA_Variant *)0x0) {
                result->statusCode = 0x80030000;
                return;
              }
              result->outputArgumentsSize = *(size_t *)((long)&pUVar5->value + 0x18);
            }
            methodCallSession = session;
            UVar3 = (*ofMethod->attachedMethod)
                              (ofMethod->methodHandle,*n2,request->inputArgumentsSize,
                               request->inputArguments,result->outputArgumentsSize,
                               result->outputArguments);
            result->statusCode = UVar3;
            methodCallSession = (UA_Session *)0x0;
            return;
          }
        }
        goto LAB_00123c44;
      }
    }
    result->statusCode = 0x805f0000;
  }
  return;
}

Assistant:

void
Service_Call_single(UA_Server *server, UA_Session *session,
                    const UA_CallMethodRequest *request,
                    UA_CallMethodResult *result) {
    /* Get/verify the method node */
    const UA_MethodNode *methodCalled =
        (const UA_MethodNode*)UA_NodeStore_get(server->nodestore, &request->methodId);
    if(!methodCalled) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }
    if(methodCalled->nodeClass != UA_NODECLASS_METHOD) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }
    if(!methodCalled->executable || !methodCalled->userExecutable || !methodCalled->attachedMethod) {
        result->statusCode = UA_STATUSCODE_BADNOTWRITABLE; // There is no NOTEXECUTABLE?
        return;
    }

    /* Get/verify the object node */
    const UA_ObjectNode *withObject =
        (const UA_ObjectNode*)UA_NodeStore_get(server->nodestore, &request->objectId);
    if(!withObject) {
        result->statusCode = UA_STATUSCODE_BADNODEIDINVALID;
        return;
    }
    if(withObject->nodeClass != UA_NODECLASS_OBJECT && withObject->nodeClass != UA_NODECLASS_OBJECTTYPE) {
        result->statusCode = UA_STATUSCODE_BADNODECLASSINVALID;
        return;
    }

    /* Verify method/object relations. Object must have a hasComponent or a
     * subtype of hasComponent reference to the method node. Therefore, check
     * every reference between the parent object and the method node if there is
     * a hasComponent (or subtype) reference */
    UA_Boolean found = false;
    UA_NodeId hasComponentNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASCOMPONENT);
    UA_NodeId hasSubTypeNodeId = UA_NODEID_NUMERIC(0,UA_NS0ID_HASSUBTYPE);
    for(size_t i = 0; i < methodCalled->referencesSize; ++i) {
        if(methodCalled->references[i].isInverse &&
           UA_NodeId_equal(&methodCalled->references[i].targetId.nodeId, &withObject->nodeId)) {
            found = isNodeInTree(server->nodestore, &methodCalled->references[i].referenceTypeId,
                                 &hasComponentNodeId, &hasSubTypeNodeId, 1);
            if(found)
                break;
        }
    }
    if(!found) {
        result->statusCode = UA_STATUSCODE_BADMETHODINVALID;
        return;
    }

    /* Verify Input Argument count, types and sizes */
    const UA_VariableNode *inputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("InputArguments"));

    if(!inputArguments) {
        if(request->inputArgumentsSize > 0) {
            result->statusCode = UA_STATUSCODE_BADINVALIDARGUMENT;
            return;
        }
    } else {
        result->statusCode = argumentsConformsToDefinition(server, inputArguments,
                                                           request->inputArgumentsSize,
                                                           request->inputArguments);
        if(result->statusCode != UA_STATUSCODE_GOOD)
            return;
    }

    /* Allocate the output arguments */
    result->outputArgumentsSize = 0; /* the default */
    const UA_VariableNode *outputArguments =
        getArgumentsVariableNode(server, methodCalled, UA_STRING("OutputArguments"));
    if(outputArguments) {
        result->outputArguments = UA_Array_new(outputArguments->value.data.value.value.arrayLength,
                                               &UA_TYPES[UA_TYPES_VARIANT]);
        if(!result->outputArguments) {
            result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
            return;
        }
        result->outputArgumentsSize = outputArguments->value.data.value.value.arrayLength;
    }

    /* Call the method */
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = session;
#endif
    result->statusCode = methodCalled->attachedMethod(methodCalled->methodHandle, withObject->nodeId,
                                                      request->inputArgumentsSize, request->inputArguments,
                                                      result->outputArgumentsSize, result->outputArguments);
#if defined(UA_ENABLE_METHODCALLS) && defined(UA_ENABLE_SUBSCRIPTIONS)
    methodCallSession = NULL;
#endif

    /* TODO: Verify Output matches the argument definition */
}